

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.hpp
# Opt level: O1

sds duckdb_hll::sdscatsds(sds s,sds t)

{
  sds pcVar1;
  
  switch(t[-1] & 7) {
  case 0:
    pcVar1 = sdscatlen(s,t,(ulong)((byte)t[-1] >> 3));
    return pcVar1;
  case 1:
    pcVar1 = sdscatlen(s,t,(ulong)(byte)t[-4]);
    return pcVar1;
  case 2:
    pcVar1 = sdscatlen(s,t,(ulong)*(ushort *)(t + -6));
    return pcVar1;
  case 3:
    pcVar1 = sdscatlen(s,t,(ulong)*(uint *)(t + -10));
    return pcVar1;
  case 4:
    pcVar1 = sdscatlen(s,t,*(size_t *)(t + -0x12));
    return pcVar1;
  default:
    pcVar1 = sdscatlen(s,t,0);
    return pcVar1;
  }
}

Assistant:

static inline size_t sdslen(const sds s) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5:
            return SDS_TYPE_5_LEN(flags);
        case SDS_TYPE_8:
            return SDS_HDR(8,s)->len;
        case SDS_TYPE_16:
            return SDS_HDR(16,s)->len;
        case SDS_TYPE_32:
            return SDS_HDR(32,s)->len;
        case SDS_TYPE_64:
            return SDS_HDR(64,s)->len;
    }
    return 0;
}